

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffmaky(fitsfile *fptr,int nrec,int *status)

{
  int *in_RDX;
  int in_ESI;
  int *in_RDI;
  int *in_stack_00000050;
  int *in_stack_00000058;
  int in_stack_00000064;
  fitsfile *in_stack_00000068;
  
  if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    ffmahd(in_stack_00000068,in_stack_00000064,in_stack_00000058,in_stack_00000050);
  }
  *(long *)(*(long *)(in_RDI + 2) + 0x80) =
       *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8) + (long)((in_ESI + -1) * 0x50);
  return *in_RDX;
}

Assistant:

int ffmaky(fitsfile *fptr,    /* I - FITS file pointer                    */
          int nrec,           /* I - one-based keyword number to move to  */
          int *status)        /* IO - error status                        */
{
/*
  move pointer to the specified absolute keyword position.  E.g. this keyword 
  will then be read by the next call to ffgnky.
*/
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] + ( (nrec - 1) * 80);

    return(*status);
}